

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::MasteringMetadata::Write(MasteringMetadata *this,IMkvWriter *writer)

{
  float fVar1;
  bool bVar2;
  uint64_t size;
  
  size = PayloadSize(this);
  if (size == 0) {
    return true;
  }
  bVar2 = WriteEbmlMasterElement(writer,0x55d0,size);
  if (bVar2) {
    fVar1 = this->luminance_max_;
    if (((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) ||
       (bVar2 = WriteEbmlElement(writer,0x55d9,fVar1), bVar2)) {
      fVar1 = this->luminance_min_;
      if ((((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) ||
          (bVar2 = WriteEbmlElement(writer,0x55da,fVar1), bVar2)) &&
         (((this->r_ == (PrimaryChromaticity *)0x0 ||
           (bVar2 = PrimaryChromaticity::Write
                              (this->r_,writer,kMkvPrimaryRChromaticityX,kMkvPrimaryRChromaticityY),
           bVar2)) &&
          (((this->g_ == (PrimaryChromaticity *)0x0 ||
            (bVar2 = PrimaryChromaticity::Write
                               (this->g_,writer,kMkvPrimaryGChromaticityX,kMkvPrimaryGChromaticityY)
            , bVar2)) &&
           ((this->b_ == (PrimaryChromaticity *)0x0 ||
            (bVar2 = PrimaryChromaticity::Write
                               (this->b_,writer,kMkvPrimaryBChromaticityX,kMkvPrimaryBChromaticityY)
            , bVar2)))))))) {
        if (this->white_point_ == (PrimaryChromaticity *)0x0) {
          return true;
        }
        bVar2 = PrimaryChromaticity::Write
                          (this->white_point_,writer,kMkvWhitePointChromaticityX,
                           kMkvWhitePointChromaticityY);
        if (bVar2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool MasteringMetadata::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvMasteringMetadata, size))
    return false;
  if (luminance_max_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvLuminanceMax, luminance_max_)) {
    return false;
  }
  if (luminance_min_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvLuminanceMin, luminance_min_)) {
    return false;
  }
  if (r_ && !r_->Write(writer, libwebm::kMkvPrimaryRChromaticityX,
                       libwebm::kMkvPrimaryRChromaticityY)) {
    return false;
  }
  if (g_ && !g_->Write(writer, libwebm::kMkvPrimaryGChromaticityX,
                       libwebm::kMkvPrimaryGChromaticityY)) {
    return false;
  }
  if (b_ && !b_->Write(writer, libwebm::kMkvPrimaryBChromaticityX,
                       libwebm::kMkvPrimaryBChromaticityY)) {
    return false;
  }
  if (white_point_ &&
      !white_point_->Write(writer, libwebm::kMkvWhitePointChromaticityX,
                           libwebm::kMkvWhitePointChromaticityY)) {
    return false;
  }

  return true;
}